

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O3

void __thiscall
ContainsFailure::ContainsFailure
          (ContainsFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *expected,SimpleString *actual,SimpleString *text)

{
  SimpleString *this_00;
  char *pcVar1;
  char *pcVar2;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_00164980;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffd0,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)&stack0xffffffffffffffd0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd0);
  pcVar1 = SimpleString::asCharString(actual);
  pcVar2 = SimpleString::asCharString(expected);
  StringFromFormat(&stack0xffffffffffffffd0,"actual <%s>\n\tdid not contain  <%s>",pcVar1,pcVar2);
  SimpleString::operator+=(this_00,(SimpleString *)&stack0xffffffffffffffd0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

ContainsFailure::ContainsFailure(UtestShell* test, const char* fileName, size_t lineNumber, const SimpleString& expected, const SimpleString& actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += StringFromFormat("actual <%s>\n\tdid not contain  <%s>", actual.asCharString(), expected.asCharString());
}